

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getDest<wasm::MemoryCopy>
          (Replacer *this,MemoryCopy *curr,Name memory,Index sizeIdx,Expression *localSet,
          Expression *additionalCheck)

{
  Builder *this_00;
  Expression *pEVar1;
  Index index;
  Block *value;
  LocalSet *pLVar2;
  LocalSet *pLVar3;
  LocalGet *leftOperand;
  LocalGet *rightOperand;
  ulong extraout_RDX;
  initializer_list<wasm::Expression_*> __l;
  optional<wasm::Type> type;
  LocalSet *local_a0;
  Expression *destGet;
  LocalSet *local_90;
  Expression *local_88;
  undefined1 local_80 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> exprs;
  allocator_type local_31;
  
  pEVar1 = additionalCheck;
  exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)localSet;
  value = (Block *)addOffsetGlobal(this,curr->dest,memory);
  if (this->parent->checkBounds == true) {
    this_00 = &this->builder;
    pLVar2 = Builder::makeLocalSet(this_00,sizeIdx,curr->size);
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                            ).
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .currFunction,(Type)(this->parent->pointerType).id);
    pLVar3 = Builder::makeLocalSet(this_00,index,(Expression *)value);
    leftOperand = Builder::makeLocalGet(this_00,index,(Type)(this->parent->pointerType).id);
    rightOperand = Builder::makeLocalGet(this_00,sizeIdx,(Type)(this->parent->pointerType).id);
    local_88 = makeAddGtuMemoryTrap
                         (this,(Expression *)leftOperand,(Expression *)rightOperand,memory);
    destGet = (Expression *)
              exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_a0;
    local_a0 = pLVar3;
    local_90 = pLVar2;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_80,__l,
               &local_31);
    if (pEVar1 != (Expression *)0x0) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_80,
                 &additionalCheck);
    }
    local_a0 = (LocalSet *)Builder::makeLocalGet(this_00,index,(Type)(this->parent->pointerType).id)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_80,
               (value_type *)&local_a0);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
    value = Builder::
            makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                      (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               local_80,type);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_80);
  }
  return (Expression *)value;
}

Assistant:

Expression* getDest(T* curr,
                        Name memory,
                        Index sizeIdx = Index(-1),
                        Expression* localSet = nullptr,
                        Expression* additionalCheck = nullptr) {
      Expression* destValue = addOffsetGlobal(curr->dest, memory);

      if (parent.checkBounds) {
        Expression* sizeSet = builder.makeLocalSet(sizeIdx, curr->size);
        Index destIdx = Builder::addVar(getFunction(), parent.pointerType);
        Expression* destSet = builder.makeLocalSet(destIdx, destValue);
        Expression* boundsCheck = makeAddGtuMemoryTrap(
          builder.makeLocalGet(destIdx, parent.pointerType),
          builder.makeLocalGet(sizeIdx, parent.pointerType),
          memory);
        std::vector<Expression*> exprs = {
          destSet, localSet, sizeSet, boundsCheck};
        if (additionalCheck) {
          exprs.push_back(additionalCheck);
        }
        Expression* destGet = builder.makeLocalGet(destIdx, parent.pointerType);
        exprs.push_back(destGet);
        return builder.makeBlock(exprs);
      }

      return destValue;
    }